

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bcatblk(bstring b,void *s,int len)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  long lVar5;
  
  iVar2 = -1;
  if ((b != (bstring)0x0) && (puVar3 = b->data, puVar3 != (uchar *)0x0)) {
    uVar4 = b->slen;
    if (((-1 < (int)uVar4) &&
        (((uVar1 = b->mlen, (int)uVar4 <= (int)uVar1 && (-1 < len)) && (s != (void *)0x0)))) &&
       (uVar1 != 0)) {
      lVar5 = (ulong)uVar4 + (ulong)(uint)len;
      uVar4 = (uint)lVar5;
      if (uVar1 <= uVar4) {
        iVar2 = balloc(b,uVar4 + 1);
        if (iVar2 < 0) {
          return -1;
        }
        puVar3 = b->data;
      }
      if (len != 0) {
        memmove(puVar3 + b->slen,s,(ulong)(uint)len);
        puVar3 = b->data;
      }
      b->slen = uVar4;
      puVar3[lVar5] = '\0';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int bcatblk (bstring b, const void * s, int len) {
int nl;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL || len < 0) return BSTR_ERR;

	if (0 > (nl = b->slen + len)) return BSTR_ERR; /* Overflow? */
	if (b->mlen <= nl && 0 > balloc (b, nl + 1)) return BSTR_ERR;

	bBlockCopy (&b->data[b->slen], s, (size_t) len);
	b->slen = nl;
	b->data[nl] = (unsigned char) '\0';
	return BSTR_OK;
}